

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O1

int ly_vlog_build_path(LY_VLOG_ELEM elem_type,void *elem,char **path,int schema_all_prefixes,
                      int data_no_last_predicate)

{
  hash_table *__s;
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  lys_node *plVar8;
  lys_node *plVar9;
  lys_node *node;
  lys_module *plVar10;
  lys_module *plVar11;
  lys_node *node_00;
  char *pcVar12;
  char *pcVar13;
  size_t sVar14;
  uint16_t str_len;
  char *pcVar15;
  long lVar16;
  ulong uVar17;
  lys_iffeature **pplVar18;
  lys_module *local_68;
  char *local_48;
  uint16_t local_34;
  uint16_t local_32 [3];
  uint16_t index;
  uint16_t length;
  
  local_32[0] = 0;
  pcVar7 = (char *)malloc(1);
  *path = pcVar7;
  if (pcVar7 == (char *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_vlog_build_path");
LAB_0010f987:
    iVar6 = -1;
  }
  else {
    local_34 = 0;
    if (elem != (void *)0x0) {
      if (3 < elem_type - LY_VLOG_XML) {
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/log.c"
               ,0x327);
        goto LAB_0010f987;
      }
      local_68 = (lys_module *)0x0;
      node = (lys_node *)0x0;
      bVar2 = false;
      node_00 = (lys_node *)elem;
      do {
        if (elem_type == LY_VLOG_LYD) {
          pcVar7 = *(char **)node_00->name;
          if (node_00->iffeature == (lys_iffeature *)0x0) {
LAB_0010f231:
            plVar11 = lyd_node_module((lyd_node *)node_00);
            local_48 = plVar11->name;
          }
          else {
            plVar11 = lyd_node_module((lyd_node *)node_00);
            plVar10 = lyd_node_module((lyd_node *)node_00->iffeature);
            if (plVar11 != plVar10) goto LAB_0010f231;
            local_48 = (char *)0x0;
          }
          if ((data_no_last_predicate == 0) || (local_34 != 0)) {
            pcVar13 = node_00->name;
            if (*(int *)(pcVar13 + 0x38) == 8) {
              if (*(char **)&node_00->nodetype != (char *)0x0) {
                pcVar13 = strchr(*(char **)&node_00->nodetype,0x27);
                pcVar12 = "\"]";
                if (pcVar13 == (char *)0x0) {
                  pcVar12 = "\']";
                }
                pcVar15 = "[.=\"";
                if (pcVar13 == (char *)0x0) {
                  pcVar15 = "[.=\'";
                }
                iVar6 = ly_vlog_build_path_print(path,&local_34,pcVar12,2,local_32);
                if (iVar6 != 0) {
                  return -1;
                }
                pcVar13 = *(char **)&node_00->nodetype;
                sVar14 = strlen(pcVar13);
                iVar6 = ly_vlog_build_path_print(path,&local_34,pcVar13,(uint16_t)sVar14,local_32);
                if (iVar6 != 0) {
                  return -1;
                }
                str_len = 4;
LAB_0010f743:
                iVar6 = ly_vlog_build_path_print(path,&local_34,pcVar15,str_len,local_32);
                if (iVar6 != 0) {
                  return -1;
                }
              }
            }
            else if (*(int *)(pcVar13 + 0x38) == 0x10) {
              uVar17 = (ulong)(byte)pcVar13[0x1e];
              if (uVar17 == 0) {
                uVar4 = lyd_list_pos((lyd_node *)node_00);
                lVar16 = 1;
                uVar5 = uVar4;
                if (9 < (int)uVar4) {
                  do {
                    lVar16 = lVar16 + 1;
                    bVar1 = 99 < uVar5;
                    uVar5 = uVar5 / 10;
                  } while (bVar1);
                }
                iVar6 = ly_vlog_build_path_print(path,&local_34,"]",1,local_32);
                if (iVar6 != 0) {
                  return -1;
                }
                pcVar13 = (char *)malloc(lVar16 + 1);
                if (pcVar13 == (char *)0x0) {
                  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                         "ly_vlog_build_path");
                  return -1;
                }
                sprintf(pcVar13,"%d",uVar4);
                iVar6 = ly_vlog_build_path_print(path,&local_34,pcVar13,(uint16_t)lVar16,local_32);
                free(pcVar13);
                if (iVar6 != 0) {
                  return -1;
                }
                pcVar15 = "[";
                str_len = 1;
                goto LAB_0010f743;
              }
              do {
                plVar9 = node_00->parent;
                if (plVar9 != (lys_node *)0x0) {
                  do {
                    if ((lys_node *)plVar9->name ==
                        *(lys_node **)(*(long *)(pcVar13 + 0x88) + (uVar17 - 1) * 8)) {
                      if (*(hash_table **)&plVar9->nodetype != (hash_table *)0x0) {
                        pcVar12 = strchr((char *)*(hash_table **)&plVar9->nodetype,0x27);
                        pcVar15 = "\"]";
                        if (pcVar12 == (char *)0x0) {
                          pcVar15 = "\']";
                        }
                        pcVar3 = "[.=\"";
                        if (pcVar12 == (char *)0x0) {
                          pcVar3 = "[.=\'";
                        }
                        iVar6 = ly_vlog_build_path_print(path,&local_34,pcVar15,2,local_32);
                        if (iVar6 != 0) {
                          return -1;
                        }
                        __s = *(hash_table **)&plVar9->nodetype;
                        sVar14 = strlen((char *)__s);
                        iVar6 = ly_vlog_build_path_print
                                          (path,&local_34,(char *)__s,(uint16_t)sVar14,local_32);
                        if (iVar6 != 0) {
                          return -1;
                        }
                        iVar6 = ly_vlog_build_path_print(path,&local_34,pcVar3 + 2,2,local_32);
                        if (iVar6 != 0) {
                          return -1;
                        }
                        pcVar12 = ((lys_node *)plVar9->name)->name;
                        sVar14 = strlen(pcVar12);
                        iVar6 = ly_vlog_build_path_print
                                          (path,&local_34,pcVar12,(uint16_t)sVar14,local_32);
                        if (iVar6 != 0) {
                          return -1;
                        }
                        plVar11 = lyd_node_module((lyd_node *)node_00);
                        plVar10 = lyd_node_module((lyd_node *)plVar9);
                        if (plVar11 != plVar10) {
                          iVar6 = ly_vlog_build_path_print(path,&local_34,":",1,local_32);
                          if (iVar6 != 0) {
                            return -1;
                          }
                          plVar11 = lyd_node_module((lyd_node *)plVar9);
                          sVar14 = strlen(plVar11->name);
                          plVar11 = lyd_node_module((lyd_node *)plVar9);
                          iVar6 = ly_vlog_build_path_print
                                            (path,&local_34,plVar11->name,(uint16_t)sVar14,local_32)
                          ;
                          if (iVar6 != 0) {
                            return -1;
                          }
                        }
                        iVar6 = ly_vlog_build_path_print(path,&local_34,"[",1,local_32);
                        if (iVar6 != 0) {
                          return -1;
                        }
                      }
                      break;
                    }
                    plVar9 = *(lys_node **)&plVar9->flags;
                  } while (plVar9 != (lys_node *)0x0);
                }
                bVar1 = 1 < (long)uVar17;
                uVar17 = uVar17 - 1;
              } while (bVar1);
            }
          }
          pplVar18 = &node_00->iffeature;
          if ((*pplVar18 == (lys_iffeature *)0x0) &&
             (plVar11 = (lys_module *)lyp_get_yang_data_template_name((lyd_node *)node_00),
             plVar11 != (lys_module *)0x0)) {
            sVar14 = strlen(pcVar7);
            iVar6 = ly_vlog_build_path_print(path,&local_34,pcVar7,(uint16_t)sVar14,local_32);
            if (iVar6 != 0) {
              return -1;
            }
            bVar2 = true;
            iVar6 = ly_vlog_build_path_print(path,&local_34,"/",1,local_32);
            pcVar7 = (char *)plVar11;
            if (iVar6 != 0) {
              return -1;
            }
          }
LAB_0010f7da:
          node_00 = (lys_node *)*pplVar18;
        }
        else {
          if (elem_type != LY_VLOG_LYS) {
            if (elem_type == LY_VLOG_XML) {
              if (*(long *)&node_00->nodetype == 0) {
                local_48 = (char *)0x0;
              }
              else {
                local_48 = *(char **)(*(long *)&node_00->nodetype + 0x18);
              }
              pcVar7 = (char *)node_00->module;
LAB_0010f253:
              pplVar18 = (lys_iffeature **)&node_00->dsc;
              goto LAB_0010f7da;
            }
            sVar14 = strlen((char *)elem);
            iVar6 = ly_vlog_build_path_print(path,&local_34,(char *)elem,(uint16_t)sVar14,local_32);
            if (iVar6 != 0) {
              return -1;
            }
            break;
          }
          node = node_00;
          if (local_68 == (lys_module *)0x0) {
            plVar8 = lys_parent(node_00);
            plVar9 = node_00;
            while (plVar8 != (lys_node *)0x0) {
              plVar9 = lys_parent(plVar9);
              plVar8 = lys_parent(plVar9);
            }
            local_68 = lys_node_module(plVar9);
          }
          do {
            node = lys_parent(node);
            if (node == (lys_node *)0x0) goto LAB_0010f27d;
          } while (node->nodetype == LYS_USES);
          plVar11 = lys_node_module(node_00);
          if ((schema_all_prefixes == 0) && (plVar11 == local_68)) {
            local_48 = (char *)0x0;
          }
          else {
LAB_0010f27d:
            plVar11 = lys_node_module(node_00);
            local_48 = plVar11->name;
          }
          if ((node_00->nodetype & (LYS_AUGMENT|LYS_GROUPING)) == LYS_UNKNOWN) {
            pcVar7 = node_00->name;
            if (node_00->nodetype == LYS_EXT) {
              pcVar7 = (char *)((lys_module *)pcVar7)->ctx;
              iVar6 = strcmp(pcVar7,"yang-data");
              if (iVar6 == 0) {
                pcVar7 = node_00->ref;
                plVar11 = lys_node_module(node_00);
                local_48 = plVar11->name;
                bVar2 = true;
              }
            }
          }
          else {
            iVar6 = ly_vlog_build_path_print(path,&local_34,"]",1,local_32);
            if (iVar6 != 0) goto LAB_0010f987;
            pcVar7 = node_00->name;
            sVar14 = strlen(pcVar7);
            iVar6 = ly_vlog_build_path_print(path,&local_34,pcVar7,(uint16_t)sVar14,local_32);
            if (iVar6 != 0) {
              return -1;
            }
            pcVar7 = "{augment}[";
            if (node_00->nodetype == LYS_GROUPING) {
              pcVar7 = "{grouping}[";
            }
          }
          if (node_00->nodetype == LYS_EXT) {
            if (node_00->padding[1] == '\x01') goto LAB_0010f253;
            node = (lys_node *)0x0;
            node_00 = (lys_node *)0x0;
          }
          else {
            do {
              node = node_00->parent;
              node_00 = lys_parent(node_00);
              if (node_00 == (lys_node *)0x0) {
                node_00 = (lys_node *)0x0;
                break;
              }
            } while (node_00->nodetype == LYS_USES);
          }
        }
        if ((lys_module *)pcVar7 != (lys_module *)0x0) {
          sVar14 = strlen(pcVar7);
          iVar6 = ly_vlog_build_path_print(path,&local_34,pcVar7,(uint16_t)sVar14,local_32);
          if (iVar6 != 0) {
            return -1;
          }
          if (local_48 != (char *)0x0) {
            if (((bVar2) &&
                (iVar6 = ly_vlog_build_path_print(path,&local_34,"#",1,local_32), iVar6 != 0)) ||
               (iVar6 = ly_vlog_build_path_print(path,&local_34,":",1,local_32), iVar6 != 0))
            goto LAB_0010f987;
            sVar14 = strlen(local_48);
            iVar6 = ly_vlog_build_path_print(path,&local_34,local_48,(uint16_t)sVar14,local_32);
            if (iVar6 != 0) {
              return -1;
            }
          }
        }
        iVar6 = ly_vlog_build_path_print(path,&local_34,"/",1,local_32);
        if (iVar6 != 0) {
          return -1;
        }
        if (((elem_type == LY_VLOG_LYS) && (node_00 == (lys_node *)0x0)) &&
           ((node != (lys_node *)0x0 && (node->nodetype == LYS_AUGMENT)))) {
          pcVar7 = node->name;
          sVar14 = strlen(pcVar7);
          iVar6 = ly_vlog_build_path_print(path,&local_34,pcVar7,(uint16_t)sVar14,local_32);
          if (iVar6 != 0) {
            return -1;
          }
        }
      } while (node_00 != (lys_node *)0x0);
    }
    uVar17 = (ulong)local_32[0];
    memmove(*path,*path + local_34,uVar17);
    (*path)[uVar17] = '\0';
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int
ly_vlog_build_path(enum LY_VLOG_ELEM elem_type, const void *elem, char **path, int schema_all_prefixes, int data_no_last_predicate)
{
    int i, j, yang_data_extension = 0;
    struct lys_node_list *slist;
    struct lys_node *sparent = NULL;
    struct lyd_node *dlist, *diter;
    const struct lys_module *top_smodule = NULL;
    const char *name, *prefix = NULL, *val_end, *val_start, *ext_name;
    char *str;
    uint16_t length, index;
    size_t len;

    length = 0;
    *path = malloc(1);
    LY_CHECK_ERR_RETURN(!(*path), LOGMEM(NULL), -1);
    index = 0;

    while (elem) {
        switch (elem_type) {
        case LY_VLOG_XML:
            name = ((struct lyxml_elem *)elem)->name;
            prefix = ((struct lyxml_elem *)elem)->ns ? ((struct lyxml_elem *)elem)->ns->prefix : NULL;
            elem = ((struct lyxml_elem *)elem)->parent;
            break;
        case LY_VLOG_LYS:
            if (!top_smodule) {
                /* remember the top module, it will act as the current module */
                for (sparent = (struct lys_node *)elem; lys_parent(sparent); sparent = lys_parent(sparent));
                top_smodule = lys_node_module(sparent);
            }

            /* skip uses */
            sparent = lys_parent((struct lys_node *)elem);
            while (sparent && (sparent->nodetype == LYS_USES)) {
                sparent = lys_parent(sparent);
            }
            if (!sparent || (lys_node_module((struct lys_node *)elem) != top_smodule) || schema_all_prefixes) {
                prefix = lys_node_module((struct lys_node *)elem)->name;
            } else {
                prefix = NULL;
            }

            if (((struct lys_node *)elem)->nodetype & (LYS_AUGMENT | LYS_GROUPING)) {
                if (ly_vlog_build_path_print(path, &index, "]", 1, &length)) {
                    return -1;
                }

                name = ((struct lys_node *)elem)->name;
                if (ly_vlog_build_path_print(path, &index, name, strlen(name), &length)) {
                    return -1;
                }

                if (((struct lys_node *)elem)->nodetype == LYS_GROUPING) {
                    name = "{grouping}[";
                } else { /* augment */
                    name = "{augment}[";
                }
            } else if (((struct lys_node *)elem)->nodetype == LYS_EXT) {
                name = ((struct lys_ext_instance *)elem)->def->name;
                if (!strcmp(name, "yang-data")) {
                    yang_data_extension = 1;
                    name = ((struct lys_ext_instance *)elem)->arg_value;
                    prefix = lys_node_module((struct lys_node *)elem)->name;
                }
            } else {
                name = ((struct lys_node *)elem)->name;
            }

            if (((struct lys_node *)elem)->nodetype == LYS_EXT) {
                if (((struct lys_ext_instance*)elem)->parent_type == LYEXT_PAR_NODE) {
                    elem = (struct lys_node*)((struct lys_ext_instance*)elem)->parent;
                } else {
                    sparent = NULL;
                    elem = NULL;
                }
                break;
            }

            /* need to find the parent again because we don't want to skip augments */
            do {
                sparent = ((struct lys_node *)elem)->parent;
                elem = lys_parent((struct lys_node *)elem);
            } while (elem && (((struct lys_node *)elem)->nodetype == LYS_USES));
            break;
        case LY_VLOG_LYD:
            name = ((struct lyd_node *)elem)->schema->name;
            if (!((struct lyd_node *)elem)->parent ||
                    lyd_node_module((struct lyd_node *)elem) != lyd_node_module(((struct lyd_node *)elem)->parent)) {
                prefix = lyd_node_module((struct lyd_node *)elem)->name;
            } else {
                prefix = NULL;
            }

            /* handle predicates (keys) in case of lists */
            if (!data_no_last_predicate || index) {
                if (((struct lyd_node *)elem)->schema->nodetype == LYS_LIST) {
                    dlist = (struct lyd_node *)elem;
                    slist = (struct lys_node_list *)((struct lyd_node *)elem)->schema;
                    if (slist->keys_size) {
                        /* schema list with keys - use key values in predicates */
                        for (i = slist->keys_size - 1; i > -1; i--) {
                            LY_TREE_FOR(dlist->child, diter) {
                                if (diter->schema == (struct lys_node *)slist->keys[i]) {
                                    break;
                                }
                            }
                            if (diter && ((struct lyd_node_leaf_list *)diter)->value_str) {
                                if (strchr(((struct lyd_node_leaf_list *)diter)->value_str, '\'')) {
                                    val_start = "=\"";
                                    val_end = "\"]";
                                } else {
                                    val_start = "='";
                                    val_end = "']";
                                }

                                /* print value */
                                if (ly_vlog_build_path_print(path, &index, val_end, 2, &length)) {
                                    return -1;
                                }
                                len = strlen(((struct lyd_node_leaf_list *)diter)->value_str);
                                if (ly_vlog_build_path_print(path, &index,
                                        ((struct lyd_node_leaf_list *)diter)->value_str, len, &length)) {
                                    return -1;
                                }

                                /* print schema name */
                                if (ly_vlog_build_path_print(path, &index, val_start, 2, &length)) {
                                    return -1;
                                }
                                len = strlen(diter->schema->name);
                                if (ly_vlog_build_path_print(path, &index, diter->schema->name, len, &length)) {
                                    return -1;
                                }

                                if (lyd_node_module(dlist) != lyd_node_module(diter)) {
                                    if (ly_vlog_build_path_print(path, &index, ":", 1, &length)) {
                                        return -1;
                                    }
                                    len = strlen(lyd_node_module(diter)->name);
                                    if (ly_vlog_build_path_print(path, &index, lyd_node_module(diter)->name, len, &length)) {
                                        return -1;
                                    }
                                }

                                if (ly_vlog_build_path_print(path, &index, "[", 1, &length)) {
                                    return -1;
                                }
                            }
                        }
                    } else {
                        /* schema list without keys - use instance position */
                        i = j = lyd_list_pos(dlist);
                        len = 1;
                        while (j > 9) {
                            ++len;
                            j /= 10;
                        }

                        if (ly_vlog_build_path_print(path, &index, "]", 1, &length)) {
                            return -1;
                        }

                        str = malloc(len + 1);
                        LY_CHECK_ERR_RETURN(!str, LOGMEM(NULL), -1);
                        sprintf(str, "%d", i);

                        if (ly_vlog_build_path_print(path, &index, str, len, &length)) {
                            free(str);
                            return -1;
                        }
                        free(str);

                        if (ly_vlog_build_path_print(path, &index, "[", 1, &length)) {
                            return -1;
                        }
                    }
                } else if (((struct lyd_node *)elem)->schema->nodetype == LYS_LEAFLIST &&
                        ((struct lyd_node_leaf_list *)elem)->value_str) {
                    if (strchr(((struct lyd_node_leaf_list *)elem)->value_str, '\'')) {
                        val_start = "[.=\"";
                        val_end = "\"]";
                    } else {
                        val_start = "[.='";
                        val_end = "']";
                    }

                    if (ly_vlog_build_path_print(path, &index, val_end, 2, &length)) {
                        return -1;
                    }
                    len = strlen(((struct lyd_node_leaf_list *)elem)->value_str);
                    if (ly_vlog_build_path_print(path, &index, ((struct lyd_node_leaf_list *)elem)->value_str, len, &length)) {
                        return -1;
                    }
                    if (ly_vlog_build_path_print(path, &index, val_start, 4, &length)) {
                        return -1;
                    }
                }
            }

            /* check if it is yang-data top element */
            if (!((struct lyd_node *)elem)->parent) {
                ext_name = lyp_get_yang_data_template_name(elem);
                if (ext_name) {
                    if (ly_vlog_build_path_print(path, &index, name, strlen(name), &length)) {
                        return -1;
                    }
                    if (ly_vlog_build_path_print(path, &index, "/", 1, &length)) {
                        return -1;
                    }
                    yang_data_extension = 1;
                    name = ext_name;
               }
            }

            elem = ((struct lyd_node *)elem)->parent;
            break;
        case LY_VLOG_STR:
            len = strlen((const char *)elem);
            if (ly_vlog_build_path_print(path, &index, (const char *)elem, len, &length)) {
                return -1;
            }
            goto success;
        default:
            /* shouldn't be here */
            LOGINT(NULL);
            return -1;
        }
        if (name) {
            if (ly_vlog_build_path_print(path, &index, name, strlen(name), &length)) {
                return -1;
            }
            if (prefix) {
                if (yang_data_extension && ly_vlog_build_path_print(path, &index, "#", 1, &length)) {
                    return -1;
                }
                if (ly_vlog_build_path_print(path, &index, ":", 1, &length)) {
                    return -1;
                }
                if (ly_vlog_build_path_print(path, &index, prefix, strlen(prefix), &length)) {
                    return -1;
                }
            }
        }
        if (ly_vlog_build_path_print(path, &index, "/", 1, &length)) {
            return -1;
        }
        if ((elem_type == LY_VLOG_LYS) && !elem && sparent && (sparent->nodetype == LYS_AUGMENT)) {
            len = strlen(((struct lys_node_augment *)sparent)->target_name);
            if (ly_vlog_build_path_print(path, &index, ((struct lys_node_augment *)sparent)->target_name, len, &length)) {
                return -1;
            }
        }
    }

success:
    memmove(*path, (*path) + index, length);
    (*path)[length] = '\0';
    return 0;
}